

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O1

void helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
               (basic_string_view<char,_std::char_traits<char>_> *val,SmallBuffer *store)

{
  char *in_RCX;
  size_t size;
  string_view val_00;
  
  size = val->_M_len + 8;
  SmallBuffer::reserve(store,size);
  store->bufferSize = size;
  val_00._M_str = in_RCX;
  val_00._M_len = (size_t)val->_M_str;
  detail::convertToBinary((detail *)store->heap,(byte *)val->_M_len,val_00);
  return;
}

Assistant:

static void convert(const X& val, SmallBuffer& store)
    {
        store.resize(detail::getBinaryLength(val));
        detail::convertToBinary(store.data(), val);
    }